

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

Var * __thiscall
jsonnet::internal::Allocator::clone<jsonnet::internal::Var>(Allocator *this,Var *ast)

{
  Var *this_00;
  Var *in_RDI;
  Var *r;
  Var *in_stack_ffffffffffffffb8;
  
  this_00 = (Var *)operator_new(0x88);
  Var::Var(in_RDI,in_stack_ffffffffffffffb8);
  std::__cxx11::list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>::push_back
            ((list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_> *)this_00,
             (value_type *)this_00);
  return this_00;
}

Assistant:

T *clone(T *ast)
    {
        auto r = new T(*ast);
        allocated.push_back(r);
        return r;
    }